

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

NodePtr avro::makePrimitive(string *t)

{
  bool bVar1;
  shared_ptr<avro::Node> *this;
  NodePrimitive *pNVar2;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  sp_counted_base *extraout_RDX_01;
  sp_counted_base *extraout_RDX_02;
  sp_counted_base *extraout_RDX_03;
  sp_counted_base *extraout_RDX_04;
  sp_counted_base *extraout_RDX_05;
  sp_counted_base *extraout_RDX_06;
  sp_counted_base *extraout_RDX_07;
  shared_count sVar3;
  element_type *in_RDI;
  NodePtr NVar4;
  undefined4 in_stack_ffffffffffffff88;
  Type in_stack_ffffffffffffff8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  NodePrimitive *in_stack_ffffffffffffffa8;
  shared_ptr<avro::Node> *in_stack_ffffffffffffffb0;
  
  bVar1 = std::operator==(in_stack_ffffffffffffff90,
                          (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar1) {
    operator_new(0x18);
    NodePrimitive::NodePrimitive
              ((NodePrimitive *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    sVar3.pi_ = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff90,
                            (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar1) {
      operator_new(0x18);
      NodePrimitive::NodePrimitive
                ((NodePrimitive *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      sVar3.pi_ = extraout_RDX_00;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff90,
                              (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
      ;
      if (bVar1) {
        operator_new(0x18);
        NodePrimitive::NodePrimitive
                  ((NodePrimitive *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        sVar3.pi_ = extraout_RDX_01;
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff90,
                                (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ));
        if (bVar1) {
          this = (shared_ptr<avro::Node> *)operator_new(0x18);
          NodePrimitive::NodePrimitive
                    ((NodePrimitive *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
                    (this,in_stack_ffffffffffffffa8);
          sVar3.pi_ = extraout_RDX_02;
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff90,
                                  (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
          if (bVar1) {
            pNVar2 = (NodePrimitive *)operator_new(0x18);
            NodePrimitive::NodePrimitive
                      ((NodePrimitive *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
            boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
                      (in_stack_ffffffffffffffb0,pNVar2);
            sVar3.pi_ = extraout_RDX_03;
          }
          else {
            bVar1 = std::operator==(in_stack_ffffffffffffff90,
                                    (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                     in_stack_ffffffffffffff88));
            if (bVar1) {
              operator_new(0x18);
              NodePrimitive::NodePrimitive
                        ((NodePrimitive *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
              boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
              sVar3.pi_ = extraout_RDX_04;
            }
            else {
              bVar1 = std::operator==(in_stack_ffffffffffffff90,
                                      (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                       in_stack_ffffffffffffff88));
              if (bVar1) {
                operator_new(0x18);
                NodePrimitive::NodePrimitive
                          ((NodePrimitive *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
                boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
                sVar3.pi_ = extraout_RDX_05;
              }
              else {
                bVar1 = std::operator==(in_stack_ffffffffffffff90,
                                        (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                         in_stack_ffffffffffffff88));
                if (bVar1) {
                  pNVar2 = (NodePrimitive *)operator_new(0x18);
                  NodePrimitive::NodePrimitive(pNVar2,in_stack_ffffffffffffff8c);
                  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
                  sVar3.pi_ = extraout_RDX_06;
                }
                else {
                  boost::shared_ptr<avro::Node>::shared_ptr((shared_ptr<avro::Node> *)0x2334c9);
                  sVar3.pi_ = extraout_RDX_07;
                }
              }
            }
          }
        }
      }
    }
  }
  NVar4.pn.pi_ = sVar3.pi_;
  NVar4.px = in_RDI;
  return NVar4;
}

Assistant:

static NodePtr makePrimitive(const std::string& t)
{
    if (t == "null") {
        return NodePtr(new NodePrimitive(AVRO_NULL));
    } else if (t == "boolean") {
        return NodePtr(new NodePrimitive(AVRO_BOOL));
    } else if (t == "int") {
        return NodePtr(new NodePrimitive(AVRO_INT));
    } else if (t == "long") {
        return NodePtr(new NodePrimitive(AVRO_LONG));
    } else if (t == "float") {
        return NodePtr(new NodePrimitive(AVRO_FLOAT));
    } else if (t == "double") {
        return NodePtr(new NodePrimitive(AVRO_DOUBLE));
    } else if (t == "string") {
        return NodePtr(new NodePrimitive(AVRO_STRING));
    } else if (t == "bytes") {
        return NodePtr(new NodePrimitive(AVRO_BYTES));
    } else {
        return NodePtr();
    }
}